

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void luaE_setdebt(global_State *g,l_mem debt)

{
  long lVar1;
  long lVar2;
  
  lVar1 = g->GCdebt + g->totalbytes;
  lVar2 = lVar1 + -0x7fffffffffffffff;
  if (lVar2 <= debt) {
    lVar2 = debt;
  }
  g->totalbytes = lVar1 - lVar2;
  g->GCdebt = lVar2;
  return;
}

Assistant:

void luaE_setdebt (global_State *g, l_mem debt) {
  l_mem tb = gettotalbytes(g);
  lua_assert(tb > 0);
  if (debt < tb - MAX_LMEM)
    debt = tb - MAX_LMEM;  /* will make 'totalbytes == MAX_LMEM' */
  g->totalbytes = tb - debt;
  g->GCdebt = debt;
}